

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_second(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
            *this,numeric_system ns)

{
  size_t __n;
  tm time;
  
  if (ns == standard) {
    __n = 0x3c;
    write(this,(int)((this->s).__r % 0x3c),(void *)0x2,0x3c);
    if ((this->ms).__r != 0) {
      time.tm_sec._0_1_ = 0x2e;
      basic_buffer<char>::push_back
                (&((this->out).container)->super_basic_buffer<char>,(char *)&time);
      write(this,(int)(this->ms).__r,(void *)0x3,__n);
    }
  }
  else {
    time.tm_isdst = 0;
    time._36_4_ = 0;
    time.tm_gmtoff = 0;
    time.tm_mon = 0;
    time.tm_year = 0;
    time.tm_wday = 0;
    time.tm_yday = 0;
    time.tm_zone = (char *)0x0;
    time.tm_hour = 0;
    time.tm_mday = 0;
    time._0_8_ = (this->s).__r % 0x3c & 0xffffffff;
    format_localized(this,&time,"%OS");
  }
  return;
}

Assistant:

void on_second(numeric_system ns) {
    if (ns == numeric_system::standard) {
      write(second(), 2);
      if (ms != std::chrono::milliseconds(0)) {
        *out++ = '.';
        write(to_int(ms.count()), 3);
      }
      return;
    }
    auto time = tm();
    time.tm_sec = second();
    format_localized(time, "%OS");
  }